

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O1

void mwTrace(char *format,...)

{
  char in_AL;
  char cVar1;
  int iVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  char *pcVar3;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list mark;
  undefined8 local_e8;
  void **local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [8];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_c0 = in_RSI;
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  if (mwInited == 0) {
    mwUseAtexit = 1;
    mwInit();
  }
  if (mwTestAlways != 0) {
    mwTestNow((char *)0x0,0,1);
  }
  if (mwOutFunction == (_func_void_int *)0x0) {
    mwOutFunction = mwDefaultOutFunc;
  }
  local_d8 = local_c8;
  local_e0 = &mark[0].overflow_arg_area;
  local_e8 = 0x3000000008;
  iVar2 = vsprintf(mwPrintBuf,format,&local_e8);
  if (0x7ff < iVar2) {
    mwPrintBuf[0x800] = '\0';
  }
  if (mwPrintBuf[0] != '\0') {
    pcVar3 = mwPrintBuf;
    cVar1 = mwPrintBuf[0];
    do {
      pcVar3 = pcVar3 + 1;
      (*mwOutFunction)((int)cVar1);
      cVar1 = *pcVar3;
    } while (cVar1 != '\0');
  }
  if (0x7ff < iVar2) {
    mwErrors = mwErrors + 1;
    iVar2 = mwFlushR();
    mwFlushingB2 = iVar2 + 1;
    mwFlushingB1 = mwFlushingB2;
    mwFlushing = mwFlushingB2;
    mwFlush();
    mwTrace(" [WARNING: OUTPUT BUFFER OVERFLOW - SYSTEM UNSTABLE]\n");
  }
  mwFlush();
  return;
}

Assistant:

void mwTrace(const char *format, ...)
{
	int tot, oflow = 0;
	va_list mark;

	mwAutoInit();
	MW_MUTEX_LOCK();
	TESTS(NULL, 0);
	if (mwOutFunction == NULL) {
		mwOutFunction = mwDefaultOutFunc;
	}

	va_start(mark, format);
	tot = vsprintf(mwPrintBuf, format, mark);
	va_end(mark);
	if (tot >= MW_TRACE_BUFFER) {
		mwPrintBuf[MW_TRACE_BUFFER] = 0;
		oflow = 1;
	}
	for (tot = 0; mwPrintBuf[tot]; tot++) {
		(*mwOutFunction)(mwPrintBuf[tot]);
	}
	if (oflow) {
		mwIncErr();
		mwTrace(" [WARNING: OUTPUT BUFFER OVERFLOW - SYSTEM UNSTABLE]\n");
	}

	FLUSH();
	MW_MUTEX_UNLOCK();
}